

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O2

int cea708_render(cea708_t *cea708,uint8_t *data,size_t size)

{
  byte bVar1;
  itu_t_t35_provider_code_t iVar2;
  cc_data_t cVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  
  *data = (char)cea708->country;
  data[1] = *(byte *)((long)&cea708->provider + 1);
  data[2] = (char)cea708->provider;
  iVar2 = cea708->provider;
  if (iVar2 == t35_provider_atsc) {
    data[3] = *(uint8_t *)((long)&cea708->user_identifier + 3);
    data[4] = *(uint8_t *)((long)&cea708->user_identifier + 2);
    data[5] = *(uint8_t *)((long)&cea708->user_identifier + 1);
    data[6] = (uint8_t)cea708->user_identifier;
    pbVar6 = data + 7;
    iVar2 = cea708->provider;
    iVar4 = 7;
  }
  else {
    pbVar6 = data + 3;
    iVar4 = 3;
  }
  if ((iVar2 == t35_provider_atsc) || (iVar2 == t35_provider_direct_tv)) {
    *pbVar6 = cea708->user_data_type_code;
    if (cea708->provider == t35_provider_direct_tv) {
      pbVar6[1] = cea708->directv_user_data_length;
      iVar4 = iVar4 + 2;
      pbVar6 = pbVar6 + 2;
    }
    else {
      iVar4 = iVar4 + 1;
      pbVar6 = pbVar6 + 1;
    }
  }
  pbVar6[1] = (cea708->user_data).field_0x1;
  bVar1 = *(byte *)&cea708->user_data;
  *pbVar6 = bVar1 >> 3 | (bVar1 & 2) << 5 | (bVar1 * '\x04' & 0x10 | bVar1 << 6) * '\x02';
  pbVar6 = pbVar6 + 2;
  for (uVar5 = 0; iVar4 = iVar4 + 3, uVar5 < (*(ushort *)&cea708->user_data >> 3 & 0x1f);
      uVar5 = uVar5 + 1) {
    cVar3 = (cea708->user_data).cc_data[uVar5];
    *pbVar6 = (byte)((uint)cVar3 >> 6) & 3 | ((byte)((uint)cVar3 >> 3) & 4) + cVar3._0_1_ * '\b';
    pbVar6[1] = (cea708->user_data).cc_data[uVar5].field_0x2;
    pbVar6[2] = (cea708->user_data).cc_data[uVar5].field_0x1;
    pbVar6 = pbVar6 + 3;
  }
  *pbVar6 = 0xff;
  return iVar4;
}

Assistant:

int cea708_render(cea708_t* cea708, uint8_t* data, size_t size)
{
    int i;
    size_t total = 0;
    data[0] = cea708->country;
    data[1] = cea708->provider >> 8;
    data[2] = cea708->provider >> 0;
    total += 3;
    data += 3;
    size -= 3;

    if (t35_provider_atsc == cea708->provider) {

        data[0] = cea708->user_identifier >> 24;
        data[1] = cea708->user_identifier >> 16;
        data[2] = cea708->user_identifier >> 8;
        data[3] = cea708->user_identifier >> 0;
        total += 4;
        data += 4;
        size -= 4;
    }

    if (t35_provider_atsc == cea708->provider || t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->user_data_type_code;
        total += 1;
        data += 1;
        size -= 1;
    }

    if (t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->directv_user_data_length;
        total += 1;
        data += 1;
        size -= 1;
    }

    data[1] = cea708->user_data.em_data;
    data[0] = (cea708->user_data.process_em_data_flag ? 0x80 : 0x00)
        | (cea708->user_data.process_cc_data_flag ? 0x40 : 0x00)
        | (cea708->user_data.additional_data_flag ? 0x20 : 0x00)
        | (cea708->user_data.cc_count & 0x1F);

    total += 2;
    data += 2;
    size -= 2;

    for (i = 0; i < (int)cea708->user_data.cc_count; ++i) {
        data[0] = (cea708->user_data.cc_data[i].marker_bits << 3) | (cea708->user_data.cc_data[i].cc_valid << 2) | cea708->user_data.cc_data[i].cc_type;
        data[1] = cea708->user_data.cc_data[i].cc_data >> 8;
        data[2] = cea708->user_data.cc_data[i].cc_data >> 0;
        total += 3;
        data += 3;
        size -= 3;
    }

    data[0] = 0xFF; //marker bits
    return (int)(total + 1);
}